

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_begin_3d(rf_camera3d camera)

{
  rf_mat *prVar1;
  rf_context *prVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  int in_stack_00000008;
  undefined1 in_stack_0000000c [12];
  rf_mat mat_view;
  rf_float16 buffer;
  rf_mat local_88;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  rf_gfx_draw();
  prVar2 = rf__ctx;
  (rf__ctx->field_0).current_matrix = &(rf__ctx->field_0).projection;
  (prVar2->field_0).current_matrix_mode = RF_PROJECTION;
  rf_gfx_push_matrix();
  prVar2 = rf__ctx;
  prVar1 = (rf__ctx->field_0).current_matrix;
  prVar1->m0 = 1.0;
  prVar1->m4 = 0.0;
  prVar1->m8 = 0.0;
  prVar1->m12 = 0.0;
  prVar1->m1 = 0.0;
  prVar1->m5 = 1.0;
  prVar1->m9 = 0.0;
  prVar1->m13 = 0.0;
  prVar1->m2 = 0.0;
  prVar1->m6 = 0.0;
  prVar1->m10 = 1.0;
  prVar1->m14 = 0.0;
  prVar1->m3 = 0.0;
  prVar1->m7 = 0.0;
  prVar1->m11 = 0.0;
  prVar1->m15 = 1.0;
  fVar3 = (float)(prVar2->field_0).current_width / (float)(prVar2->field_0).current_height;
  if (in_stack_00000008 == 1) {
    dVar4 = (double)mat_view.m2 * 0.5;
    dVar5 = (double)fVar3 * dVar4;
    rf_gfx_ortho(-dVar5,dVar5,-dVar4,dVar4,0.01,1000.0);
  }
  else if (in_stack_00000008 == 0) {
    dVar5 = tan((double)mat_view.m2 * 0.5 * 0.01745329238474369);
    dVar5 = dVar5 * 0.01;
    dVar4 = (double)fVar3 * dVar5;
    rf_gfx_frustum(-dVar4,dVar4,-dVar5,dVar5,0.01,1000.0);
  }
  prVar2 = rf__ctx;
  (rf__ctx->field_0).current_matrix = &(rf__ctx->field_0).modelview;
  (prVar2->field_0).current_matrix_mode = RF_MODELVIEW;
  (prVar2->field_0).modelview.m0 = 1.0;
  (prVar2->field_0).modelview.m4 = 0.0;
  (prVar2->field_0).modelview.m8 = 0.0;
  (prVar2->field_0).modelview.m12 = 0.0;
  (prVar2->field_0).modelview.m1 = 0.0;
  (prVar2->field_0).modelview.m5 = 1.0;
  (prVar2->field_0).modelview.m9 = 0.0;
  (prVar2->field_0).modelview.m13 = 0.0;
  (prVar2->field_0).modelview.m2 = 0.0;
  (prVar2->field_0).modelview.m6 = 0.0;
  (prVar2->field_0).modelview.m10 = 1.0;
  (prVar2->field_0).modelview.m14 = 0.0;
  (prVar2->field_0).modelview.m3 = 0.0;
  (prVar2->field_0).modelview.m7 = 0.0;
  (prVar2->field_0).modelview.m11 = 0.0;
  (prVar2->field_0).modelview.m15 = 1.0;
  rf_mat_look_at(&local_88,(rf_vec3)in_stack_0000000c,(rf_vec3)mat_view._8_12_,
                 (rf_vec3)mat_view._20_12_);
  local_48 = local_88.m0;
  local_44 = local_88.m1;
  local_40 = local_88.m2;
  local_3c = local_88.m3;
  local_38 = local_88.m4;
  local_34 = local_88.m5;
  local_30 = local_88.m6;
  local_2c = local_88.m7;
  local_28 = local_88.m8;
  local_24 = local_88.m9;
  local_20 = local_88.m10;
  local_1c = local_88.m11;
  local_18 = local_88.m12;
  local_14 = local_88.m13;
  local_10 = local_88.m14;
  local_c = local_88.m15;
  rf_gfx_mult_matrixf(&local_48);
  (*(rf__ctx->field_0).gfx_ctx.gl.Enable)(0xb71);
  return;
}

Assistant:

RF_API void rf_begin_3d(rf_camera3d camera)
{
    rf_gfx_draw();

    rf_gfx_matrix_mode(RF_PROJECTION); // Switch to GL_PROJECTION matrix
    rf_gfx_push_matrix(); // Save previous matrix, which contains the settings for the 2d ortho GL_PROJECTION
    rf_gfx_load_identity(); // Reset current matrix (PROJECTION)

    float aspect = (float) rf_ctx.current_width / (float)rf_ctx.current_height;

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Setup perspective GL_PROJECTION
        double top = 0.01 * tan(camera.fovy*0.5*RF_DEG2RAD);
        double right = top*aspect;

        rf_gfx_frustum(-right, right, -top, top, 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        // Setup orthographic GL_PROJECTION
        double top = camera.fovy/2.0;
        double right = top*aspect;

        rf_gfx_ortho(-right,right,-top,top, 0.01, 1000.0);
    }

    // NOTE: zNear and zFar values are important when computing depth buffer values

    rf_gfx_matrix_mode(RF_MODELVIEW); // Switch back to rf_gfxobal_model_view matrix
    rf_gfx_load_identity(); // Reset current matrix (MODELVIEW)

    // Setup rf_camera3d view
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);
    rf_gfx_mult_matrixf(rf_mat_to_float16(mat_view).v); // Multiply MODELVIEW matrix by view matrix (camera)

    rf_gfx_enable_depth_test(); // Enable DEPTH_TEST for 3D
}